

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

void secp256k1_selftest(void)

{
  int iVar1;
  char *in_RAX;
  secp256k1_callback *unaff_retaddr;
  
  iVar1 = secp256k1_selftest_passes();
  if (iVar1 == 0) {
    secp256k1_callback_call(unaff_retaddr,in_RAX);
  }
  return;
}

Assistant:

void secp256k1_selftest(void) {
    if (!secp256k1_selftest_passes()) {
        secp256k1_callback_call(&default_error_callback, "self test failed");
    }
}